

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Geometry *pGVar11;
  RTCRayQueryContext *pRVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 (*pauVar18) [16];
  undefined4 uVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  uint uVar22;
  Scene *pSVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  float fVar32;
  float fVar38;
  float fVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  float fVar73;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar75;
  float fVar84;
  float fVar85;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar86;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar87;
  float fVar95;
  float fVar96;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar98;
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar104;
  float fVar105;
  undefined1 auVar103 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar127;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar125;
  float fVar126;
  undefined1 auVar124 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  float fVar132;
  undefined1 auVar133 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [64];
  float fVar138;
  undefined1 auVar139 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [64];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar149 [64];
  float fVar153;
  float fVar154;
  undefined1 auVar155 [16];
  float fVar162;
  undefined1 auVar156 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar163;
  undefined1 auVar157 [64];
  float fVar164;
  float fVar165;
  undefined1 auVar166 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar167 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1389;
  ulong local_1388;
  undefined1 local_1380 [16];
  undefined8 local_1370;
  float fStack_1368;
  float fStack_1364;
  undefined8 local_1360;
  float fStack_1358;
  float fStack_1354;
  undefined8 local_1350;
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  size_t local_12f8;
  RayHitK<8> *local_12f0;
  undefined1 (*local_12e8) [16];
  undefined1 (*local_12e0) [16];
  long local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  RTCFilterFunctionNArguments local_12a0;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 *local_1230;
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [16];
  RTCHitN local_10c0 [16];
  undefined1 auStack_10b0 [16];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [16];
  undefined1 auStack_ff0 [16];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar20 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1130._4_4_ = uVar19;
  local_1130._0_4_ = uVar19;
  local_1130._8_4_ = uVar19;
  local_1130._12_4_ = uVar19;
  auVar113 = ZEXT1664(local_1130);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1140._4_4_ = uVar19;
  local_1140._0_4_ = uVar19;
  local_1140._8_4_ = uVar19;
  local_1140._12_4_ = uVar19;
  auVar124 = ZEXT1664(local_1140);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1150._4_4_ = uVar19;
  local_1150._0_4_ = uVar19;
  local_1150._8_4_ = uVar19;
  local_1150._12_4_ = uVar19;
  auVar131 = ZEXT1664(local_1150);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar33 = ZEXT416((uint)(fVar3 * 0.99999964));
  local_1160 = vshufps_avx(auVar33,auVar33,0);
  auVar134 = ZEXT1664(local_1160);
  auVar33 = ZEXT416((uint)(fVar4 * 0.99999964));
  local_1170 = vshufps_avx(auVar33,auVar33,0);
  auVar140 = ZEXT1664(local_1170);
  auVar33 = ZEXT416((uint)(fVar5 * 0.99999964));
  local_1180 = vshufps_avx(auVar33,auVar33,0);
  auVar145 = ZEXT1664(local_1180);
  auVar33 = ZEXT416((uint)(fVar3 * 1.0000004));
  local_1190 = vshufps_avx(auVar33,auVar33,0);
  auVar149 = ZEXT1664(local_1190);
  auVar33 = ZEXT416((uint)(fVar4 * 1.0000004));
  local_11a0 = vshufps_avx(auVar33,auVar33,0);
  auVar157 = ZEXT1664(local_11a0);
  auVar33 = ZEXT416((uint)(fVar5 * 1.0000004));
  local_11b0 = vshufps_avx(auVar33,auVar33,0);
  auVar167 = ZEXT1664(local_11b0);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12c8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_12d0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar30 = uVar26 ^ 0x10;
  uVar31 = local_12c8 ^ 0x10;
  uVar29 = local_12d0 ^ 0x10;
  iVar6 = (tray->tnear).field_0.i[k];
  local_1270._4_4_ = iVar6;
  local_1270._0_4_ = iVar6;
  local_1270._8_4_ = iVar6;
  local_1270._12_4_ = iVar6;
  auVar103 = ZEXT1664(local_1270);
  uVar22 = 1 << ((byte)k & 0x1f);
  iVar6 = (tray->tfar).field_0.i[k];
  auVar37 = ZEXT1664(CONCAT412(iVar6,CONCAT48(iVar6,CONCAT44(iVar6,iVar6))));
  local_12e0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar22 & 0xf) << 4));
  local_12e8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar22 >> 4) * 0x10);
  local_12f0 = ray;
  local_12f8 = k;
  local_1388 = uVar26;
LAB_0038d68d:
  do {
    pauVar18 = pauVar20 + -1;
    pauVar20 = pauVar20 + -1;
    if (*(float *)(*pauVar18 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar24 = *(ulong *)*pauVar20;
      while ((uVar24 & 8) == 0) {
        uVar27 = uVar24 & 0xfffffffffffffff0;
        fVar3 = *(float *)(ray + k * 4 + 0xe0);
        auVar41._4_4_ = fVar3;
        auVar41._0_4_ = fVar3;
        auVar41._8_4_ = fVar3;
        auVar41._12_4_ = fVar3;
        pfVar2 = (float *)(uVar27 + 0x80 + uVar26);
        pfVar1 = (float *)(uVar27 + 0x20 + uVar26);
        auVar33._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar33._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar33._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar33._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar33 = vsubps_avx(auVar33,auVar113._0_16_);
        auVar42._0_4_ = auVar134._0_4_ * auVar33._0_4_;
        auVar42._4_4_ = auVar134._4_4_ * auVar33._4_4_;
        auVar42._8_4_ = auVar134._8_4_ * auVar33._8_4_;
        auVar42._12_4_ = auVar134._12_4_ * auVar33._12_4_;
        pfVar2 = (float *)(uVar27 + 0x80 + local_12c8);
        auVar33 = vmaxps_avx(auVar103._0_16_,auVar42);
        pfVar1 = (float *)(uVar27 + 0x20 + local_12c8);
        auVar61._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar61._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar61._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar61._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar42 = vsubps_avx(auVar61,auVar124._0_16_);
        pfVar2 = (float *)(uVar27 + 0x80 + local_12d0);
        pfVar1 = (float *)(uVar27 + 0x20 + local_12d0);
        auVar76._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar76._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar76._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar76._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar63._0_4_ = auVar140._0_4_ * auVar42._0_4_;
        auVar63._4_4_ = auVar140._4_4_ * auVar42._4_4_;
        auVar63._8_4_ = auVar140._8_4_ * auVar42._8_4_;
        auVar63._12_4_ = auVar140._12_4_ * auVar42._12_4_;
        auVar42 = vsubps_avx(auVar76,auVar131._0_16_);
        auVar77._0_4_ = auVar145._0_4_ * auVar42._0_4_;
        auVar77._4_4_ = auVar145._4_4_ * auVar42._4_4_;
        auVar77._8_4_ = auVar145._8_4_ * auVar42._8_4_;
        auVar77._12_4_ = auVar145._12_4_ * auVar42._12_4_;
        auVar42 = vmaxps_avx(auVar63,auVar77);
        pfVar2 = (float *)(uVar27 + 0x80 + uVar30);
        pfVar1 = (float *)(uVar27 + 0x20 + uVar30);
        auVar78._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar78._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar78._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar78._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar33 = vmaxps_avx(auVar33,auVar42);
        auVar42 = vsubps_avx(auVar78,auVar113._0_16_);
        pfVar2 = (float *)(uVar27 + 0x80 + uVar31);
        auVar64._0_4_ = auVar149._0_4_ * auVar42._0_4_;
        auVar64._4_4_ = auVar149._4_4_ * auVar42._4_4_;
        auVar64._8_4_ = auVar149._8_4_ * auVar42._8_4_;
        auVar64._12_4_ = auVar149._12_4_ * auVar42._12_4_;
        pfVar1 = (float *)(uVar27 + 0x20 + uVar31);
        auVar79._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar79._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar79._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar79._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar42 = vsubps_avx(auVar79,auVar124._0_16_);
        pfVar2 = (float *)(uVar27 + 0x80 + uVar29);
        pfVar1 = (float *)(uVar27 + 0x20 + uVar29);
        auVar88._0_4_ = fVar3 * *pfVar2 + *pfVar1;
        auVar88._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
        auVar88._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
        auVar88._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
        auVar80._0_4_ = auVar157._0_4_ * auVar42._0_4_;
        auVar80._4_4_ = auVar157._4_4_ * auVar42._4_4_;
        auVar80._8_4_ = auVar157._8_4_ * auVar42._8_4_;
        auVar80._12_4_ = auVar157._12_4_ * auVar42._12_4_;
        auVar42 = vsubps_avx(auVar88,auVar131._0_16_);
        auVar89._0_4_ = auVar167._0_4_ * auVar42._0_4_;
        auVar89._4_4_ = auVar167._4_4_ * auVar42._4_4_;
        auVar89._8_4_ = auVar167._8_4_ * auVar42._8_4_;
        auVar89._12_4_ = auVar167._12_4_ * auVar42._12_4_;
        auVar42 = vminps_avx(auVar80,auVar89);
        auVar61 = vminps_avx(auVar37._0_16_,auVar64);
        auVar42 = vminps_avx(auVar61,auVar42);
        if (((uint)uVar24 & 7) == 6) {
          auVar61 = vcmpps_avx(auVar33,auVar42,2);
          auVar42 = vcmpps_avx(*(undefined1 (*) [16])(uVar27 + 0xe0),auVar41,2);
          auVar41 = vcmpps_avx(auVar41,*(undefined1 (*) [16])(uVar27 + 0xf0),1);
          auVar42 = vandps_avx(auVar42,auVar41);
          auVar42 = vandps_avx(auVar42,auVar61);
        }
        else {
          auVar42 = vcmpps_avx(auVar33,auVar42,2);
        }
        auVar42 = vpslld_avx(auVar42,0x1f);
        uVar22 = vmovmskps_avx(auVar42);
        local_10c0 = (RTCHitN  [16])auVar33;
        if (uVar22 == 0) {
          if (pauVar20 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0038d68d;
        }
        uVar22 = uVar22 & 0xff;
        lVar25 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
          }
        }
        uVar24 = *(ulong *)(uVar27 + lVar25 * 8);
        uVar22 = uVar22 - 1 & uVar22;
        if (uVar22 != 0) {
          uVar8 = *(uint *)(local_10c0 + lVar25 * 4);
          lVar25 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar27 + lVar25 * 8);
          uVar9 = *(uint *)(local_10c0 + lVar25 * 4);
          uVar22 = uVar22 - 1 & uVar22;
          uVar26 = local_1388;
          if (uVar22 == 0) {
            if (uVar8 < uVar9) {
              *(ulong *)*pauVar20 = uVar10;
              *(uint *)(*pauVar20 + 8) = uVar9;
              pauVar20 = pauVar20 + 1;
            }
            else {
              *(ulong *)*pauVar20 = uVar24;
              *(uint *)(*pauVar20 + 8) = uVar8;
              pauVar20 = pauVar20 + 1;
              uVar24 = uVar10;
            }
          }
          else {
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar24;
            auVar33 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar8));
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar10;
            auVar42 = vpunpcklqdq_avx(auVar50,ZEXT416(uVar9));
            lVar25 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
              }
            }
            auVar65._8_8_ = 0;
            auVar65._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
            auVar41 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_10c0 + lVar25 * 4)));
            auVar61 = vpcmpgtd_avx(auVar42,auVar33);
            uVar22 = uVar22 - 1 & uVar22;
            if (uVar22 == 0) {
              auVar63 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar42,auVar33,auVar63);
              auVar33 = vblendvps_avx(auVar33,auVar42,auVar63);
              auVar42 = vpcmpgtd_avx(auVar41,auVar61);
              auVar63 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar41,auVar61,auVar63);
              auVar61 = vblendvps_avx(auVar61,auVar41,auVar63);
              auVar41 = vpcmpgtd_avx(auVar61,auVar33);
              auVar63 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar61,auVar33,auVar63);
              auVar33 = vblendvps_avx(auVar33,auVar61,auVar63);
              *pauVar20 = auVar33;
              pauVar20[1] = auVar41;
              uVar24 = auVar42._0_8_;
              pauVar20 = pauVar20 + 2;
            }
            else {
              lVar25 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              auVar90._8_8_ = 0;
              auVar90._0_8_ = *(ulong *)(uVar27 + lVar25 * 8);
              auVar64 = vpunpcklqdq_avx(auVar90,ZEXT416(*(uint *)(local_10c0 + lVar25 * 4)));
              auVar63 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar42,auVar33,auVar63);
              auVar33 = vblendvps_avx(auVar33,auVar42,auVar63);
              auVar42 = vpcmpgtd_avx(auVar64,auVar41);
              auVar63 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar64,auVar41,auVar63);
              auVar41 = vblendvps_avx(auVar41,auVar64,auVar63);
              auVar63 = vpcmpgtd_avx(auVar41,auVar33);
              auVar64 = vpshufd_avx(auVar63,0xaa);
              auVar63 = vblendvps_avx(auVar41,auVar33,auVar64);
              auVar33 = vblendvps_avx(auVar33,auVar41,auVar64);
              auVar41 = vpcmpgtd_avx(auVar42,auVar61);
              auVar64 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar42,auVar61,auVar64);
              auVar42 = vblendvps_avx(auVar61,auVar42,auVar64);
              auVar61 = vpcmpgtd_avx(auVar63,auVar42);
              auVar64 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar63,auVar42,auVar64);
              auVar42 = vblendvps_avx(auVar42,auVar63,auVar64);
              *pauVar20 = auVar33;
              pauVar20[1] = auVar42;
              pauVar20[2] = auVar61;
              auVar103 = ZEXT1664(local_1270);
              uVar24 = auVar41._0_8_;
              pauVar20 = pauVar20 + 3;
            }
          }
        }
      }
      local_12d8 = (ulong)((uint)uVar24 & 0xf) - 8;
      if (local_12d8 != 0) {
        uVar24 = uVar24 & 0xfffffffffffffff0;
        lVar25 = 0;
        do {
          lVar28 = lVar25 * 0x140;
          fVar3 = *(float *)(ray + k * 4 + 0xe0);
          pfVar2 = (float *)(uVar24 + 0x90 + lVar28);
          pfVar1 = (float *)(uVar24 + lVar28);
          auVar155._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar155._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar155._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar155._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0xa0 + lVar28);
          pfVar1 = (float *)(uVar24 + 0x10 + lVar28);
          auVar51._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar51._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar51._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar51._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0xb0 + lVar28);
          pfVar1 = (float *)(uVar24 + 0x20 + lVar28);
          auVar139._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar139._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar139._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar139._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0xc0 + lVar28);
          pfVar1 = (float *)(uVar24 + 0x30 + lVar28);
          auVar81._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar81._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar81._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar81._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0xd0 + lVar28);
          pfVar1 = (float *)(uVar24 + 0x40 + lVar28);
          auVar91._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar91._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar91._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar91._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0xe0 + lVar28);
          pfVar1 = (float *)(uVar24 + 0x50 + lVar28);
          auVar44._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar44._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar44._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar44._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0xf0 + lVar28);
          pfVar1 = (float *)(uVar24 + 0x60 + lVar28);
          auVar166._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar166._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar166._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar166._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0x100 + lVar28);
          pfVar1 = (float *)(uVar24 + 0x70 + lVar28);
          auVar115._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar115._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar115._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar115._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          pfVar1 = (float *)(uVar24 + 0x110 + lVar28);
          pfVar2 = (float *)(uVar24 + 0x80 + lVar28);
          auVar128._0_4_ = fVar3 * *pfVar1 + *pfVar2;
          auVar128._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
          auVar128._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
          auVar128._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
          uVar19 = *(undefined4 *)(ray + k * 4);
          auVar133._4_4_ = uVar19;
          auVar133._0_4_ = uVar19;
          auVar133._8_4_ = uVar19;
          auVar133._12_4_ = uVar19;
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar144._4_4_ = uVar19;
          auVar144._0_4_ = uVar19;
          auVar144._8_4_ = uVar19;
          auVar144._12_4_ = uVar19;
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar148._4_4_ = uVar19;
          auVar148._0_4_ = uVar19;
          auVar148._8_4_ = uVar19;
          auVar148._12_4_ = uVar19;
          local_1380 = vsubps_avx(auVar155,auVar133);
          local_1320 = vsubps_avx(auVar51,auVar144);
          auVar33 = vsubps_avx(auVar139,auVar148);
          auVar42 = vsubps_avx(auVar81,auVar133);
          auVar61 = vsubps_avx(auVar91,auVar144);
          auVar41 = vsubps_avx(auVar44,auVar148);
          auVar63 = vsubps_avx(auVar166,auVar133);
          auVar64 = vsubps_avx(auVar115,auVar144);
          auVar76 = vsubps_avx(auVar128,auVar148);
          auVar77 = vsubps_avx(auVar63,local_1380);
          local_10d0 = vsubps_avx(auVar64,local_1320);
          local_10e0 = vsubps_avx(auVar76,auVar33);
          fVar3 = local_1320._0_4_;
          fVar75 = auVar64._0_4_ + fVar3;
          fVar5 = local_1320._4_4_;
          fVar84 = auVar64._4_4_ + fVar5;
          fVar73 = local_1320._8_4_;
          fVar85 = auVar64._8_4_ + fVar73;
          fVar15 = local_1320._12_4_;
          fVar86 = auVar64._12_4_ + fVar15;
          fVar153 = auVar33._0_4_;
          fVar87 = fVar153 + auVar76._0_4_;
          fVar158 = auVar33._4_4_;
          fVar95 = fVar158 + auVar76._4_4_;
          fVar160 = auVar33._8_4_;
          fVar96 = fVar160 + auVar76._8_4_;
          fVar162 = auVar33._12_4_;
          fVar97 = fVar162 + auVar76._12_4_;
          fVar32 = local_10e0._0_4_;
          auVar116._0_4_ = fVar75 * fVar32;
          fVar38 = local_10e0._4_4_;
          auVar116._4_4_ = fVar84 * fVar38;
          fVar39 = local_10e0._8_4_;
          auVar116._8_4_ = fVar85 * fVar39;
          fVar40 = local_10e0._12_4_;
          auVar116._12_4_ = fVar86 * fVar40;
          fVar164 = local_10d0._0_4_;
          auVar129._0_4_ = fVar164 * fVar87;
          fVar168 = local_10d0._4_4_;
          auVar129._4_4_ = fVar168 * fVar95;
          fVar170 = local_10d0._8_4_;
          auVar129._8_4_ = fVar170 * fVar96;
          fVar172 = local_10d0._12_4_;
          auVar129._12_4_ = fVar172 * fVar97;
          auVar78 = vsubps_avx(auVar129,auVar116);
          fVar4 = local_1380._0_4_;
          fVar114 = auVar63._0_4_ + fVar4;
          fVar14 = local_1380._4_4_;
          fVar125 = auVar63._4_4_ + fVar14;
          fVar74 = local_1380._8_4_;
          fVar126 = auVar63._8_4_ + fVar74;
          fVar16 = local_1380._12_4_;
          fVar127 = auVar63._12_4_ + fVar16;
          fVar132 = auVar77._0_4_;
          auVar92._0_4_ = fVar132 * fVar87;
          fVar135 = auVar77._4_4_;
          auVar92._4_4_ = fVar135 * fVar95;
          fVar136 = auVar77._8_4_;
          auVar92._8_4_ = fVar136 * fVar96;
          fVar137 = auVar77._12_4_;
          auVar92._12_4_ = fVar137 * fVar97;
          auVar130._0_4_ = fVar114 * fVar32;
          auVar130._4_4_ = fVar125 * fVar38;
          auVar130._8_4_ = fVar126 * fVar39;
          auVar130._12_4_ = fVar127 * fVar40;
          auVar77 = vsubps_avx(auVar130,auVar92);
          auVar117._0_4_ = fVar114 * fVar164;
          auVar117._4_4_ = fVar125 * fVar168;
          auVar117._8_4_ = fVar126 * fVar170;
          auVar117._12_4_ = fVar127 * fVar172;
          auVar82._0_4_ = fVar132 * fVar75;
          auVar82._4_4_ = fVar135 * fVar84;
          auVar82._8_4_ = fVar136 * fVar85;
          auVar82._12_4_ = fVar137 * fVar86;
          auVar79 = vsubps_avx(auVar82,auVar117);
          local_1360._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          local_1350._4_4_ = *(float *)(ray + k * 4 + 0xa0);
          local_1370._4_4_ = *(float *)(ray + k * 4 + 0x80);
          local_1260._0_4_ =
               auVar78._0_4_ * local_1370._4_4_ +
               local_1360._4_4_ * auVar79._0_4_ + local_1350._4_4_ * auVar77._0_4_;
          local_1260._4_4_ =
               auVar78._4_4_ * local_1370._4_4_ +
               local_1360._4_4_ * auVar79._4_4_ + local_1350._4_4_ * auVar77._4_4_;
          local_1260._8_4_ =
               auVar78._8_4_ * local_1370._4_4_ +
               local_1360._4_4_ * auVar79._8_4_ + local_1350._4_4_ * auVar77._8_4_;
          local_1260._12_4_ =
               auVar78._12_4_ * local_1370._4_4_ +
               local_1360._4_4_ * auVar79._12_4_ + local_1350._4_4_ * auVar77._12_4_;
          local_10f0 = vsubps_avx(local_1320,auVar61);
          auVar33 = vsubps_avx(auVar33,auVar41);
          fVar75 = auVar61._0_4_ + fVar3;
          fVar84 = auVar61._4_4_ + fVar5;
          fVar85 = auVar61._8_4_ + fVar73;
          fVar86 = auVar61._12_4_ + fVar15;
          fVar87 = fVar153 + auVar41._0_4_;
          fVar95 = fVar158 + auVar41._4_4_;
          fVar96 = fVar160 + auVar41._8_4_;
          fVar97 = fVar162 + auVar41._12_4_;
          fVar165 = auVar33._0_4_;
          auVar156._0_4_ = fVar165 * fVar75;
          fVar169 = auVar33._4_4_;
          auVar156._4_4_ = fVar169 * fVar84;
          fVar171 = auVar33._8_4_;
          auVar156._8_4_ = fVar171 * fVar85;
          fVar173 = auVar33._12_4_;
          auVar156._12_4_ = fVar173 * fVar86;
          fVar146 = local_10f0._0_4_;
          auVar66._0_4_ = fVar146 * fVar87;
          fVar150 = local_10f0._4_4_;
          auVar66._4_4_ = fVar150 * fVar95;
          fVar151 = local_10f0._8_4_;
          auVar66._8_4_ = fVar151 * fVar96;
          fVar152 = local_10f0._12_4_;
          auVar66._12_4_ = fVar152 * fVar97;
          auVar33 = vsubps_avx(auVar66,auVar156);
          auVar77 = vsubps_avx(local_1380,auVar42);
          fVar138 = auVar77._0_4_;
          auVar93._0_4_ = fVar138 * fVar87;
          fVar141 = auVar77._4_4_;
          auVar93._4_4_ = fVar141 * fVar95;
          fVar142 = auVar77._8_4_;
          auVar93._8_4_ = fVar142 * fVar96;
          fVar143 = auVar77._12_4_;
          auVar93._12_4_ = fVar143 * fVar97;
          fVar87 = auVar42._0_4_ + fVar4;
          fVar95 = auVar42._4_4_ + fVar14;
          fVar96 = auVar42._8_4_ + fVar74;
          fVar97 = auVar42._12_4_ + fVar16;
          auVar118._0_4_ = fVar165 * fVar87;
          auVar118._4_4_ = fVar169 * fVar95;
          auVar118._8_4_ = fVar171 * fVar96;
          auVar118._12_4_ = fVar173 * fVar97;
          auVar77 = vsubps_avx(auVar118,auVar93);
          auVar107._0_4_ = fVar146 * fVar87;
          auVar107._4_4_ = fVar150 * fVar95;
          auVar107._8_4_ = fVar151 * fVar96;
          auVar107._12_4_ = fVar152 * fVar97;
          auVar83._0_4_ = fVar138 * fVar75;
          auVar83._4_4_ = fVar141 * fVar84;
          auVar83._8_4_ = fVar142 * fVar85;
          auVar83._12_4_ = fVar143 * fVar86;
          auVar78 = vsubps_avx(auVar83,auVar107);
          local_1250._0_4_ =
               local_1370._4_4_ * auVar33._0_4_ +
               local_1360._4_4_ * auVar78._0_4_ + local_1350._4_4_ * auVar77._0_4_;
          local_1250._4_4_ =
               local_1370._4_4_ * auVar33._4_4_ +
               local_1360._4_4_ * auVar78._4_4_ + local_1350._4_4_ * auVar77._4_4_;
          local_1250._8_4_ =
               local_1370._4_4_ * auVar33._8_4_ +
               local_1360._4_4_ * auVar78._8_4_ + local_1350._4_4_ * auVar77._8_4_;
          local_1250._12_4_ =
               local_1370._4_4_ * auVar33._12_4_ +
               local_1360._4_4_ * auVar78._12_4_ + local_1350._4_4_ * auVar77._12_4_;
          auVar33 = vsubps_avx(auVar42,auVar63);
          fVar75 = auVar42._0_4_ + auVar63._0_4_;
          fVar84 = auVar42._4_4_ + auVar63._4_4_;
          fVar85 = auVar42._8_4_ + auVar63._8_4_;
          fVar86 = auVar42._12_4_ + auVar63._12_4_;
          auVar42 = vsubps_avx(auVar61,auVar64);
          fVar87 = auVar61._0_4_ + auVar64._0_4_;
          fVar95 = auVar61._4_4_ + auVar64._4_4_;
          fVar96 = auVar61._8_4_ + auVar64._8_4_;
          fVar97 = auVar61._12_4_ + auVar64._12_4_;
          auVar61 = vsubps_avx(auVar41,auVar76);
          fVar98 = auVar41._0_4_ + auVar76._0_4_;
          fVar104 = auVar41._4_4_ + auVar76._4_4_;
          fVar105 = auVar41._8_4_ + auVar76._8_4_;
          fVar106 = auVar41._12_4_ + auVar76._12_4_;
          fVar154 = auVar61._0_4_;
          auVar108._0_4_ = fVar154 * fVar87;
          fVar159 = auVar61._4_4_;
          auVar108._4_4_ = fVar159 * fVar95;
          fVar161 = auVar61._8_4_;
          auVar108._8_4_ = fVar161 * fVar96;
          fVar163 = auVar61._12_4_;
          auVar108._12_4_ = fVar163 * fVar97;
          fVar114 = auVar42._0_4_;
          auVar119._0_4_ = fVar114 * fVar98;
          fVar125 = auVar42._4_4_;
          auVar119._4_4_ = fVar125 * fVar104;
          fVar126 = auVar42._8_4_;
          auVar119._8_4_ = fVar126 * fVar105;
          fVar127 = auVar42._12_4_;
          auVar119._12_4_ = fVar127 * fVar106;
          auVar42 = vsubps_avx(auVar119,auVar108);
          fVar147 = auVar33._0_4_;
          auVar99._0_4_ = fVar147 * fVar98;
          fVar98 = auVar33._4_4_;
          auVar99._4_4_ = fVar98 * fVar104;
          fVar104 = auVar33._8_4_;
          auVar99._8_4_ = fVar104 * fVar105;
          fVar105 = auVar33._12_4_;
          auVar99._12_4_ = fVar105 * fVar106;
          auVar120._0_4_ = fVar154 * fVar75;
          auVar120._4_4_ = fVar159 * fVar84;
          auVar120._8_4_ = fVar161 * fVar85;
          auVar120._12_4_ = fVar163 * fVar86;
          auVar33 = vsubps_avx(auVar120,auVar99);
          auVar52._0_4_ = fVar75 * fVar114;
          auVar52._4_4_ = fVar84 * fVar125;
          auVar52._8_4_ = fVar85 * fVar126;
          auVar52._12_4_ = fVar86 * fVar127;
          auVar67._0_4_ = fVar147 * fVar87;
          auVar67._4_4_ = fVar98 * fVar95;
          auVar67._8_4_ = fVar104 * fVar96;
          auVar67._12_4_ = fVar105 * fVar97;
          auVar61 = vsubps_avx(auVar67,auVar52);
          local_1360._0_4_ = local_1360._4_4_;
          fStack_1358 = local_1360._4_4_;
          fStack_1354 = local_1360._4_4_;
          local_1350._0_4_ = local_1350._4_4_;
          fStack_1348 = local_1350._4_4_;
          fStack_1344 = local_1350._4_4_;
          local_1370._0_4_ = local_1370._4_4_;
          fStack_1368 = local_1370._4_4_;
          fStack_1364 = local_1370._4_4_;
          auVar53._0_4_ =
               local_1370._4_4_ * auVar42._0_4_ +
               local_1360._4_4_ * auVar61._0_4_ + local_1350._4_4_ * auVar33._0_4_;
          auVar53._4_4_ =
               local_1370._4_4_ * auVar42._4_4_ +
               local_1360._4_4_ * auVar61._4_4_ + local_1350._4_4_ * auVar33._4_4_;
          auVar53._8_4_ =
               local_1370._4_4_ * auVar42._8_4_ +
               local_1360._4_4_ * auVar61._8_4_ + local_1350._4_4_ * auVar33._8_4_;
          auVar53._12_4_ =
               local_1370._4_4_ * auVar42._12_4_ +
               local_1360._4_4_ * auVar61._12_4_ + local_1350._4_4_ * auVar33._12_4_;
          local_1240._0_4_ = auVar53._0_4_ + local_1260._0_4_ + local_1250._0_4_;
          local_1240._4_4_ = auVar53._4_4_ + local_1260._4_4_ + local_1250._4_4_;
          local_1240._8_4_ = auVar53._8_4_ + local_1260._8_4_ + local_1250._8_4_;
          local_1240._12_4_ = auVar53._12_4_ + local_1260._12_4_ + local_1250._12_4_;
          auVar33 = vminps_avx(local_1260,local_1250);
          auVar33 = vminps_avx(auVar33,auVar53);
          auVar100._8_4_ = 0x7fffffff;
          auVar100._0_8_ = 0x7fffffff7fffffff;
          auVar100._12_4_ = 0x7fffffff;
          local_1120 = vandps_avx(local_1240,auVar100);
          auVar101._0_4_ = local_1120._0_4_ * 1.1920929e-07;
          auVar101._4_4_ = local_1120._4_4_ * 1.1920929e-07;
          auVar101._8_4_ = local_1120._8_4_ * 1.1920929e-07;
          auVar101._12_4_ = local_1120._12_4_ * 1.1920929e-07;
          uVar27 = CONCAT44(auVar101._4_4_,auVar101._0_4_);
          auVar109._0_8_ = uVar27 ^ 0x8000000080000000;
          auVar109._8_4_ = -auVar101._8_4_;
          auVar109._12_4_ = -auVar101._12_4_;
          auVar33 = vcmpps_avx(auVar33,auVar109,5);
          local_1100 = local_1260;
          local_1110 = local_1250;
          auVar42 = vmaxps_avx(local_1260,local_1250);
          auVar42 = vmaxps_avx(auVar42,auVar53);
          auVar42 = vcmpps_avx(auVar42,auVar101,2);
          auVar33 = vorps_avx(auVar33,auVar42);
          if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar33[0xf] < '\0') {
            auVar54._0_4_ = fVar146 * fVar32;
            auVar54._4_4_ = fVar150 * fVar38;
            auVar54._8_4_ = fVar151 * fVar39;
            auVar54._12_4_ = fVar152 * fVar40;
            auVar68._0_4_ = fVar165 * fVar164;
            auVar68._4_4_ = fVar169 * fVar168;
            auVar68._8_4_ = fVar171 * fVar170;
            auVar68._12_4_ = fVar173 * fVar172;
            auVar41 = vsubps_avx(auVar68,auVar54);
            auVar102._0_4_ = fVar114 * fVar165;
            auVar102._4_4_ = fVar125 * fVar169;
            auVar102._8_4_ = fVar126 * fVar171;
            auVar102._12_4_ = fVar127 * fVar173;
            auVar110._0_4_ = fVar146 * fVar154;
            auVar110._4_4_ = fVar150 * fVar159;
            auVar110._8_4_ = fVar151 * fVar161;
            auVar110._12_4_ = fVar152 * fVar163;
            auVar63 = vsubps_avx(auVar110,auVar102);
            auVar121._8_4_ = 0x7fffffff;
            auVar121._0_8_ = 0x7fffffff7fffffff;
            auVar121._12_4_ = 0x7fffffff;
            auVar42 = vandps_avx(auVar121,auVar54);
            auVar61 = vandps_avx(auVar121,auVar102);
            auVar42 = vcmpps_avx(auVar42,auVar61,1);
            local_11e0 = vblendvps_avx(auVar63,auVar41,auVar42);
            auVar45._0_4_ = fVar138 * fVar154;
            auVar45._4_4_ = fVar141 * fVar159;
            auVar45._8_4_ = fVar142 * fVar161;
            auVar45._12_4_ = fVar143 * fVar163;
            auVar55._0_4_ = fVar138 * fVar32;
            auVar55._4_4_ = fVar141 * fVar38;
            auVar55._8_4_ = fVar142 * fVar39;
            auVar55._12_4_ = fVar143 * fVar40;
            auVar69._0_4_ = fVar132 * fVar165;
            auVar69._4_4_ = fVar135 * fVar169;
            auVar69._8_4_ = fVar136 * fVar171;
            auVar69._12_4_ = fVar137 * fVar173;
            auVar41 = vsubps_avx(auVar55,auVar69);
            auVar111._0_4_ = fVar165 * fVar147;
            auVar111._4_4_ = fVar169 * fVar98;
            auVar111._8_4_ = fVar171 * fVar104;
            auVar111._12_4_ = fVar173 * fVar105;
            auVar63 = vsubps_avx(auVar111,auVar45);
            auVar42 = vandps_avx(auVar121,auVar69);
            auVar61 = vandps_avx(auVar121,auVar45);
            auVar42 = vcmpps_avx(auVar42,auVar61,1);
            local_11d0 = vblendvps_avx(auVar63,auVar41,auVar42);
            auVar56._0_4_ = fVar146 * fVar147;
            auVar56._4_4_ = fVar150 * fVar98;
            auVar56._8_4_ = fVar151 * fVar104;
            auVar56._12_4_ = fVar152 * fVar105;
            auVar70._0_4_ = fVar132 * fVar146;
            auVar70._4_4_ = fVar135 * fVar150;
            auVar70._8_4_ = fVar136 * fVar151;
            auVar70._12_4_ = fVar137 * fVar152;
            auVar94._0_4_ = fVar138 * fVar164;
            auVar94._4_4_ = fVar141 * fVar168;
            auVar94._8_4_ = fVar142 * fVar170;
            auVar94._12_4_ = fVar143 * fVar172;
            auVar34._0_4_ = fVar138 * fVar114;
            auVar34._4_4_ = fVar141 * fVar125;
            auVar34._8_4_ = fVar142 * fVar126;
            auVar34._12_4_ = fVar143 * fVar127;
            auVar41 = vsubps_avx(auVar70,auVar94);
            auVar63 = vsubps_avx(auVar34,auVar56);
            auVar42 = vandps_avx(auVar121,auVar94);
            auVar61 = vandps_avx(auVar121,auVar56);
            auVar42 = vcmpps_avx(auVar42,auVar61,1);
            local_11c0 = vblendvps_avx(auVar63,auVar41,auVar42);
            fVar32 = local_11e0._0_4_ * local_1370._4_4_ +
                     local_11c0._0_4_ * local_1360._4_4_ + local_11d0._0_4_ * local_1350._4_4_;
            fVar38 = local_11e0._4_4_ * local_1370._4_4_ +
                     local_11c0._4_4_ * local_1360._4_4_ + local_11d0._4_4_ * local_1350._4_4_;
            fVar39 = local_11e0._8_4_ * local_1370._4_4_ +
                     local_11c0._8_4_ * local_1360._4_4_ + local_11d0._8_4_ * local_1350._4_4_;
            fVar40 = local_11e0._12_4_ * local_1370._4_4_ +
                     local_11c0._12_4_ * local_1360._4_4_ + local_11d0._12_4_ * local_1350._4_4_;
            auVar35._0_4_ = fVar32 + fVar32;
            auVar35._4_4_ = fVar38 + fVar38;
            auVar35._8_4_ = fVar39 + fVar39;
            auVar35._12_4_ = fVar40 + fVar40;
            fVar32 = local_11e0._0_4_ * fVar4 +
                     local_11c0._0_4_ * fVar153 + local_11d0._0_4_ * fVar3;
            fVar38 = local_11e0._4_4_ * fVar14 +
                     local_11c0._4_4_ * fVar158 + local_11d0._4_4_ * fVar5;
            fVar73 = local_11e0._8_4_ * fVar74 +
                     local_11c0._8_4_ * fVar160 + local_11d0._8_4_ * fVar73;
            fVar74 = local_11e0._12_4_ * fVar16 +
                     local_11c0._12_4_ * fVar162 + local_11d0._12_4_ * fVar15;
            auVar42 = vrcpps_avx(auVar35);
            fVar3 = auVar42._0_4_;
            auVar112._0_4_ = auVar35._0_4_ * fVar3;
            fVar4 = auVar42._4_4_;
            auVar112._4_4_ = auVar35._4_4_ * fVar4;
            fVar5 = auVar42._8_4_;
            auVar112._8_4_ = auVar35._8_4_ * fVar5;
            fVar14 = auVar42._12_4_;
            auVar112._12_4_ = auVar35._12_4_ * fVar14;
            auVar122._8_4_ = 0x3f800000;
            auVar122._0_8_ = 0x3f8000003f800000;
            auVar122._12_4_ = 0x3f800000;
            auVar42 = vsubps_avx(auVar122,auVar112);
            local_11f0._0_4_ = (fVar32 + fVar32) * (fVar3 + fVar3 * auVar42._0_4_);
            local_11f0._4_4_ = (fVar38 + fVar38) * (fVar4 + fVar4 * auVar42._4_4_);
            local_11f0._8_4_ = (fVar73 + fVar73) * (fVar5 + fVar5 * auVar42._8_4_);
            local_11f0._12_4_ = (fVar74 + fVar74) * (fVar14 + fVar14 * auVar42._12_4_);
            auVar103 = ZEXT1664(local_11f0);
            uVar19 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar71._4_4_ = uVar19;
            auVar71._0_4_ = uVar19;
            auVar71._8_4_ = uVar19;
            auVar71._12_4_ = uVar19;
            auVar42 = vcmpps_avx(auVar71,local_11f0,2);
            uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar123._4_4_ = uVar19;
            auVar123._0_4_ = uVar19;
            auVar123._8_4_ = uVar19;
            auVar123._12_4_ = uVar19;
            auVar37 = ZEXT1664(auVar123);
            auVar61 = vcmpps_avx(local_11f0,auVar123,2);
            auVar42 = vandps_avx(auVar61,auVar42);
            auVar61 = auVar33 & auVar42;
            if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar61[0xf] < '\0') {
              auVar33 = vandps_avx(auVar33,auVar42);
              auVar42 = vcmpps_avx(auVar35,_DAT_01f7aa10,4);
              auVar61 = auVar42 & auVar33;
              if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar61[0xf] < '\0') {
                local_1310 = vandps_avx(auVar33,auVar42);
                local_1230 = &local_1389;
                auVar33 = vrcpps_avx(local_1240);
                fVar3 = auVar33._0_4_;
                auVar57._0_4_ = local_1240._0_4_ * fVar3;
                fVar4 = auVar33._4_4_;
                auVar57._4_4_ = local_1240._4_4_ * fVar4;
                fVar5 = auVar33._8_4_;
                auVar57._8_4_ = local_1240._8_4_ * fVar5;
                fVar14 = auVar33._12_4_;
                auVar57._12_4_ = local_1240._12_4_ * fVar14;
                auVar72._8_4_ = 0x3f800000;
                auVar72._0_8_ = 0x3f8000003f800000;
                auVar72._12_4_ = 0x3f800000;
                auVar33 = vsubps_avx(auVar72,auVar57);
                auVar46._0_4_ = fVar3 + fVar3 * auVar33._0_4_;
                auVar46._4_4_ = fVar4 + fVar4 * auVar33._4_4_;
                auVar46._8_4_ = fVar5 + fVar5 * auVar33._8_4_;
                auVar46._12_4_ = fVar14 + fVar14 * auVar33._12_4_;
                auVar58._8_4_ = 0x219392ef;
                auVar58._0_8_ = 0x219392ef219392ef;
                auVar58._12_4_ = 0x219392ef;
                auVar33 = vcmpps_avx(local_1120,auVar58,5);
                auVar33 = vandps_avx(auVar33,auVar46);
                auVar59._0_4_ = local_1260._0_4_ * auVar33._0_4_;
                auVar59._4_4_ = local_1260._4_4_ * auVar33._4_4_;
                auVar59._8_4_ = local_1260._8_4_ * auVar33._8_4_;
                auVar59._12_4_ = local_1260._12_4_ * auVar33._12_4_;
                local_1210 = vminps_avx(auVar59,auVar72);
                auVar47._0_4_ = local_1250._0_4_ * auVar33._0_4_;
                auVar47._4_4_ = local_1250._4_4_ * auVar33._4_4_;
                auVar47._8_4_ = local_1250._8_4_ * auVar33._8_4_;
                auVar47._12_4_ = local_1250._12_4_ * auVar33._12_4_;
                local_1200 = vminps_avx(auVar47,auVar72);
                auVar60._8_4_ = 0x7f800000;
                auVar60._0_8_ = 0x7f8000007f800000;
                auVar60._12_4_ = 0x7f800000;
                auVar33 = vblendvps_avx(auVar60,local_11f0,local_1310);
                auVar42 = vshufps_avx(auVar33,auVar33,0xb1);
                auVar42 = vminps_avx(auVar42,auVar33);
                auVar61 = vshufpd_avx(auVar42,auVar42,1);
                auVar42 = vminps_avx(auVar61,auVar42);
                auVar33 = vcmpps_avx(auVar33,auVar42,0);
                auVar61 = local_1310 & auVar33;
                auVar42 = vpcmpeqd_avx(auVar42,auVar42);
                if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar61[0xf] < '\0') {
                  auVar42 = auVar33;
                }
                lVar28 = lVar28 + uVar24;
                auVar33 = vandps_avx(local_1310,auVar42);
                uVar19 = vmovmskps_avx(auVar33);
                uVar27 = CONCAT44((int)((ulong)context >> 0x20),uVar19);
                lVar21 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                local_1350 = context->scene;
                pSVar23 = context->scene;
                local_1220 = local_1310;
LAB_0038df6d:
                uVar22 = *(uint *)(lVar28 + 0x120 + lVar21 * 4);
                pGVar11 = (pSVar23->geometries).items[uVar22].ptr;
                local_1360 = (long)pGVar11;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1310 + lVar21 * 4) = 0;
                }
                else {
                  local_1370 = lVar21;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar19 = *(undefined4 *)(local_1210 + lVar21 * 4);
                    uVar7 = *(undefined4 *)(local_1200 + lVar21 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11f0 + lVar21 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_11e0 + lVar21 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_11d0 + lVar21 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11c0 + lVar21 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar19;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar7;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)(lVar28 + 0x130 + lVar21 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar22;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    goto LAB_0038e45d;
                  }
                  uVar19 = *(undefined4 *)(local_1210 + lVar21 * 4);
                  local_1060._4_4_ = uVar19;
                  local_1060._0_4_ = uVar19;
                  local_1060._8_4_ = uVar19;
                  local_1060._12_4_ = uVar19;
                  local_1060._16_4_ = uVar19;
                  local_1060._20_4_ = uVar19;
                  local_1060._24_4_ = uVar19;
                  local_1060._28_4_ = uVar19;
                  local_1040 = *(undefined4 *)(local_1200 + lVar21 * 4);
                  pRVar12 = context->user;
                  local_1380._0_8_ = pRVar12;
                  auStack_ff0 = vpshufd_avx(ZEXT416(uVar22),0);
                  local_1020 = *(undefined4 *)(lVar28 + 0x130 + lVar21 * 4);
                  uVar19 = *(undefined4 *)(local_11e0 + lVar21 * 4);
                  local_10c0._4_4_ = uVar19;
                  local_10c0._0_4_ = uVar19;
                  local_10c0._8_4_ = uVar19;
                  local_10c0._12_4_ = uVar19;
                  register0x00001310 = uVar19;
                  register0x00001314 = uVar19;
                  register0x00001318 = uVar19;
                  register0x0000131c = uVar19;
                  uVar19 = *(undefined4 *)(local_11d0 + lVar21 * 4);
                  local_10a0._4_4_ = uVar19;
                  local_10a0._0_4_ = uVar19;
                  local_10a0._8_4_ = uVar19;
                  local_10a0._12_4_ = uVar19;
                  local_10a0._16_4_ = uVar19;
                  local_10a0._20_4_ = uVar19;
                  local_10a0._24_4_ = uVar19;
                  local_10a0._28_4_ = uVar19;
                  uVar19 = *(undefined4 *)(local_11c0 + lVar21 * 4);
                  local_1080._4_4_ = uVar19;
                  local_1080._0_4_ = uVar19;
                  local_1080._8_4_ = uVar19;
                  local_1080._12_4_ = uVar19;
                  local_1080._16_4_ = uVar19;
                  local_1080._20_4_ = uVar19;
                  local_1080._24_4_ = uVar19;
                  local_1080._28_4_ = uVar19;
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  uStack_101c = local_1020;
                  uStack_1018 = local_1020;
                  uStack_1014 = local_1020;
                  uStack_1010 = local_1020;
                  uStack_100c = local_1020;
                  uStack_1008 = local_1020;
                  uStack_1004 = local_1020;
                  local_1000 = auStack_ff0;
                  vcmpps_avx(local_1060,local_1060,0xf);
                  uStack_fdc = pRVar12->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = pRVar12->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11f0 + lVar21 * 4);
                  local_12c0 = *local_12e0;
                  local_12b0 = *local_12e8;
                  local_12a0.valid = (int *)local_12c0;
                  local_12a0.geometryUserPtr = pGVar11->userPtr;
                  local_12a0.context = context->user;
                  local_12a0.hit = local_10c0;
                  local_12a0.N = 8;
                  local_12a0.ray = (RTCRayN *)ray;
                  if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_1380._0_8_ = lVar25;
                    local_1320._0_8_ = lVar28;
                    local_1330 = auVar103._0_16_;
                    local_1340 = auVar37._0_16_;
                    (*pGVar11->intersectionFilterN)(&local_12a0);
                    auVar37 = ZEXT1664(local_1340);
                    auVar103 = ZEXT1664(local_1330);
                    k = local_12f8;
                    lVar25 = local_1380._0_8_;
                    ray = local_12f0;
                    uVar26 = local_1388;
                    lVar28 = local_1320._0_8_;
                  }
                  auVar33 = vpcmpeqd_avx(local_12c0,ZEXT816(0) << 0x40);
                  auVar42 = vpcmpeqd_avx(local_12b0,ZEXT816(0) << 0x40);
                  auVar62._16_16_ = auVar42;
                  auVar62._0_16_ = auVar33;
                  auVar17 = vcmpps_avx(ZEXT1632(auVar42),ZEXT1632(auVar42),0xf);
                  auVar62 = auVar17 & ~auVar62;
                  if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar62 >> 0x7f,0) == '\0') &&
                        (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar62 >> 0xbf,0) == '\0') &&
                      (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar62[0x1f]) {
                    auVar36._0_4_ = auVar33._0_4_ ^ auVar17._0_4_;
                    auVar36._4_4_ = auVar33._4_4_ ^ auVar17._4_4_;
                    auVar36._8_4_ = auVar33._8_4_ ^ auVar17._8_4_;
                    auVar36._12_4_ = auVar33._12_4_ ^ auVar17._12_4_;
                    auVar36._16_4_ = auVar42._0_4_ ^ auVar17._16_4_;
                    auVar36._20_4_ = auVar42._4_4_ ^ auVar17._20_4_;
                    auVar36._24_4_ = auVar42._8_4_ ^ auVar17._24_4_;
                    auVar36._28_4_ = auVar42._12_4_ ^ auVar17._28_4_;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_1360 + 0x3e) & 0x40) != 0)))) {
                      local_1380._0_8_ = lVar25;
                      local_1320._0_8_ = lVar28;
                      local_1330 = auVar103._0_16_;
                      local_1340 = auVar37._0_16_;
                      (*p_Var13)(&local_12a0);
                      auVar37 = ZEXT1664(local_1340);
                      auVar103 = ZEXT1664(local_1330);
                      k = local_12f8;
                      lVar25 = local_1380._0_8_;
                      ray = local_12f0;
                      uVar26 = local_1388;
                      lVar28 = local_1320._0_8_;
                    }
                    auVar61 = ZEXT816(0) << 0x40;
                    auVar33 = vpcmpeqd_avx(local_12c0,auVar61);
                    auVar42 = vpcmpeqd_avx(local_12b0,auVar61);
                    auVar49._16_16_ = auVar42;
                    auVar49._0_16_ = auVar33;
                    auVar17 = vcmpps_avx(ZEXT1632(auVar61),ZEXT1632(auVar61),0xf);
                    auVar36._0_4_ = auVar33._0_4_ ^ auVar17._0_4_;
                    auVar36._4_4_ = auVar33._4_4_ ^ auVar17._4_4_;
                    auVar36._8_4_ = auVar33._8_4_ ^ auVar17._8_4_;
                    auVar36._12_4_ = auVar33._12_4_ ^ auVar17._12_4_;
                    auVar36._16_4_ = auVar42._0_4_ ^ auVar17._16_4_;
                    auVar36._20_4_ = auVar42._4_4_ ^ auVar17._20_4_;
                    auVar36._24_4_ = auVar42._8_4_ ^ auVar17._24_4_;
                    auVar36._28_4_ = auVar42._12_4_ ^ auVar17._28_4_;
                    auVar17 = auVar17 & ~auVar49;
                    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar17 >> 0x7f,0) != '\0') ||
                          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar17 >> 0xbf,0) != '\0') ||
                        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar17[0x1f] < '\0') {
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])local_12a0.hit);
                      *(undefined1 (*) [32])(local_12a0.ray + 0x180) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_12a0.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x1a0) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_12a0.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x1c0) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_12a0.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x1e0) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_12a0.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x200) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_12a0.hit + 0xa0)
                                              );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x220) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_12a0.hit + 0xc0)
                                              );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x240) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])(local_12a0.hit + 0xe0)
                                              );
                      *(undefined1 (*) [32])(local_12a0.ray + 0x260) = auVar17;
                      auVar17 = vmaskmovps_avx(auVar36,*(undefined1 (*) [32])
                                                        (local_12a0.hit + 0x100));
                      *(undefined1 (*) [32])(local_12a0.ray + 0x280) = auVar17;
                    }
                  }
                  if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar36 >> 0x7f,0) == '\0') &&
                        (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar36 >> 0xbf,0) == '\0') &&
                      (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar36[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar37._0_4_;
                  }
                  else {
                    auVar37 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_1310 + local_1370 * 4) = 0;
                  auVar33 = vshufps_avx(auVar37._0_16_,auVar37._0_16_,0);
                  auVar33 = vcmpps_avx(auVar103._0_16_,auVar33,2);
                  local_1310 = vandps_avx(auVar33,local_1310);
                  lVar21 = local_1370;
                }
                if ((((local_1310 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1310 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1310 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1310[0xf]) goto LAB_0038e45d;
                auVar48._8_4_ = 0x7f800000;
                auVar48._0_8_ = 0x7f8000007f800000;
                auVar48._12_4_ = 0x7f800000;
                auVar33 = vblendvps_avx(auVar48,auVar103._0_16_,local_1310);
                auVar42 = vshufps_avx(auVar33,auVar33,0xb1);
                auVar42 = vminps_avx(auVar42,auVar33);
                auVar61 = vshufpd_avx(auVar42,auVar42,1);
                auVar42 = vminps_avx(auVar61,auVar42);
                auVar42 = vcmpps_avx(auVar33,auVar42,0);
                auVar61 = local_1310 & auVar42;
                auVar33 = local_1310;
                if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar61[0xf] < '\0') {
                  auVar33 = vandps_avx(auVar42,local_1310);
                }
                uVar19 = vmovmskps_avx(auVar33);
                uVar27 = CONCAT44((int)((ulong)lVar21 >> 0x20),uVar19);
                lVar21 = 0;
                pSVar23 = local_1350;
                if (uVar27 != 0) {
                  for (; (uVar27 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                  }
                }
                goto LAB_0038df6d;
              }
            }
          }
LAB_0038e45d:
          lVar25 = lVar25 + 1;
        } while (lVar25 != local_12d8);
      }
      uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,uVar19))));
      auVar113 = ZEXT1664(local_1130);
      auVar124 = ZEXT1664(local_1140);
      auVar131 = ZEXT1664(local_1150);
      auVar134 = ZEXT1664(local_1160);
      auVar140 = ZEXT1664(local_1170);
      auVar145 = ZEXT1664(local_1180);
      auVar149 = ZEXT1664(local_1190);
      auVar157 = ZEXT1664(local_11a0);
      auVar167 = ZEXT1664(local_11b0);
      auVar103 = ZEXT1664(local_1270);
    }
    if (pauVar20 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }